

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O3

int arg_match_helper(arg *arg_,arg_def *def,char **argv,char *err_msg)

{
  char cVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *__s1;
  
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  pcVar4 = *argv;
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  if (*pcVar4 != '-') {
    return 0;
  }
  if (def->short_name == (char *)0x0) {
LAB_00120542:
    pcVar3 = def->long_name;
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    __n = strlen(pcVar3);
    if (pcVar4[1] != '-') {
      return 0;
    }
    __s1 = pcVar4 + 2;
    iVar2 = strncmp(__s1,pcVar3,__n);
    if (iVar2 != 0) {
      return 0;
    }
    cVar1 = pcVar4[__n + 2];
    if ((cVar1 != '=') && (cVar1 != '\0')) {
      return 0;
    }
    pcVar3 = (char *)0x0;
    if (cVar1 == '=') {
      pcVar3 = pcVar4 + __n + 3;
    }
    iVar2 = def->has_val;
    uVar5 = 1;
  }
  else {
    __s1 = pcVar4 + 1;
    iVar2 = strcmp(__s1,def->short_name);
    if (iVar2 != 0) goto LAB_00120542;
    iVar2 = def->has_val;
    if (iVar2 == 0) {
      uVar5 = 1;
      pcVar3 = (char *)0x0;
      goto LAB_00120614;
    }
    pcVar3 = argv[1];
    uVar5 = 2;
  }
  if (iVar2 == -1) {
LAB_00120614:
    arg_->argv = argv;
    arg_->name = __s1;
    arg_->val = pcVar3;
    arg_->argv_step = uVar5;
    arg_->def = def;
    return 1;
  }
  if (iVar2 == 0 || pcVar3 != (char *)0x0) {
    if (pcVar3 == (char *)0x0 || iVar2 != 0) goto LAB_00120614;
    if (err_msg == (char *)0x0) {
      return 0;
    }
    pcVar4 = "Error: option %s requires no argument.\n";
  }
  else {
    if (err_msg == (char *)0x0) {
      return 0;
    }
    pcVar4 = "Error: option %s requires argument.\n";
  }
  snprintf(err_msg,200,pcVar4,__s1);
  return 0;
}

Assistant:

int arg_match_helper(struct arg *arg_, const struct arg_def *def, char **argv,
                     char *err_msg) {
  struct arg arg;

  if (err_msg) err_msg[0] = '\0';

  assert(def->has_val == 0 || def->has_val == 1 || def->has_val == -1);

  if (!argv[0] || argv[0][0] != '-') return 0;

  arg = arg_init(argv);

  if (def->short_name && !strcmp(arg.argv[0] + 1, def->short_name)) {
    arg.name = arg.argv[0] + 1;
    arg.val = def->has_val ? arg.argv[1] : NULL;
    arg.argv_step = def->has_val ? 2 : 1;
  } else if (def->long_name) {
    const size_t name_len = strlen(def->long_name);

    if (arg.argv[0][1] == '-' &&
        !strncmp(arg.argv[0] + 2, def->long_name, name_len) &&
        (arg.argv[0][name_len + 2] == '=' ||
         arg.argv[0][name_len + 2] == '\0')) {
      arg.name = arg.argv[0] + 2;
      arg.val = arg.name[name_len] == '=' ? arg.name + name_len + 1 : NULL;
      arg.argv_step = 1;
    }
  }

  if (arg.name) {
    if (def->has_val == -1) {
      arg.def = def;
      *arg_ = arg;
      return 1;
    }

    if (!arg.val && def->has_val) {
      SET_ERR_STRING("Error: option %s requires argument.\n", arg.name);
      return 0;
    }

    if (arg.val && !def->has_val) {
      SET_ERR_STRING("Error: option %s requires no argument.\n", arg.name);
      return 0;
    }

    arg.def = def;
    *arg_ = arg;
    return 1;
  }

  return 0;
}